

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.hpp
# Opt level: O0

void __thiscall Atari2600::Bus::Bus(Bus *this)

{
  Bus *this_local;
  
  this->_vptr_Bus = (_func_int **)&PTR__Bus_00c9ce70;
  PIA::PIA(&this->mos6532_);
  TIA::TIA(&this->tia_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  TIASound::TIASound(&this->tia_sound_,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<Atari2600::TIASound>::PullLowpass(&this->speaker_,&this->tia_sound_)
  ;
  this->tia_input_value_[0] = 0xff;
  this->tia_input_value_[1] = 0xff;
  Cycles::Cycles(&this->cycles_since_speaker_update_);
  Cycles::Cycles(&this->cycles_since_video_update_);
  Cycles::Cycles(&this->cycles_since_6532_update_);
  return;
}

Assistant:

Bus() :
			tia_sound_(audio_queue_),
			speaker_(tia_sound_) {}